

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalCSE.cpp
# Opt level: O3

void __thiscall wasm::anon_unknown_166::Applier::visitExpression(Applier *this,Expression *curr)

{
  mapped_type mVar1;
  ulong uVar2;
  __node_base_ptr p_Var3;
  Type type_;
  _Hash_node_base *p_Var4;
  _Hash_node_base *p_Var5;
  _Hash_node_base *p_Var6;
  Module *pMVar7;
  uintptr_t uVar8;
  undefined1 auVar9 [16];
  Index IVar10;
  mapped_type *pmVar11;
  LocalSet *this_00;
  const_iterator cVar12;
  Expression *pEVar13;
  __hash_code __code_1;
  ulong uVar14;
  Type in_R8;
  __hash_code __code;
  _Hash_node_base *p_Var15;
  Expression *local_40;
  Expression *curr_local;
  
  uVar2 = (this->requestInfos).
          super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
          ._M_h._M_bucket_count;
  uVar14 = (ulong)curr % uVar2;
  p_Var3 = (this->requestInfos).
           super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
           ._M_h._M_buckets[uVar14];
  if (p_Var3 != (__node_base_ptr)0x0) {
    p_Var15 = p_Var3->_M_nxt;
    pEVar13 = (Expression *)p_Var15[1]._M_nxt;
    while (pEVar13 != curr) {
      p_Var15 = p_Var15->_M_nxt;
      if (p_Var15 == (_Hash_node_base *)0x0) {
        return;
      }
      pEVar13 = (Expression *)p_Var15[1]._M_nxt;
      if ((ulong)pEVar13 % uVar2 != uVar14) {
        return;
      }
    }
    local_40 = curr;
    RequestInfo::validate((RequestInfo *)(ulong)*(uint *)&p_Var15[2]._M_nxt);
    if (*(int *)&p_Var15[2]._M_nxt == 0) {
      p_Var15 = p_Var15 + 3;
      p_Var4 = p_Var15->_M_nxt;
      if (p_Var4 != (_Hash_node_base *)0x0) {
        uVar2 = (this->requestInfos).
                super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
                ._M_h._M_bucket_count;
        uVar14 = (ulong)p_Var4 % uVar2;
        p_Var3 = (this->requestInfos).
                 super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
                 ._M_h._M_buckets[uVar14];
        if (p_Var3 != (__node_base_ptr)0x0) {
          p_Var5 = p_Var3->_M_nxt;
          p_Var6 = p_Var5[1]._M_nxt;
          do {
            if (p_Var6 == p_Var4) {
              if (*(int *)&p_Var5[2]._M_nxt == 0) {
                return;
              }
              curr_local = (Expression *)&this->originalLocalMap;
              cVar12 = std::
                       _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_unsigned_int>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       ::find((_Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_unsigned_int>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                               *)curr_local,(key_type *)p_Var15);
              if (cVar12.
                  super__Node_iterator_base<std::pair<wasm::Expression_*const,_unsigned_int>,_false>
                  ._M_cur != (__node_type *)0x0) {
                pMVar7 = (this->
                         super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                         ).
                         super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                         .
                         super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                         .currModule;
                pmVar11 = std::__detail::
                          _Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_unsigned_int>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          ::operator[]((_Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_unsigned_int>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                        *)curr_local,(key_type *)p_Var15);
                mVar1 = *pmVar11;
                uVar8 = (curr->type).id;
                pEVar13 = (Expression *)MixedArena::allocSpace(&pMVar7->allocator,0x18,8);
                pEVar13->_id = LocalGetId;
                *(mapped_type *)(pEVar13 + 1) = mVar1;
                (pEVar13->type).id = uVar8;
                Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                ::replaceCurrent((Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                                  *)this,pEVar13);
                *(int *)&p_Var5[2]._M_nxt = *(int *)&p_Var5[2]._M_nxt + -1;
                return;
              }
              __assert_fail("originalLocalMap.count(info.original)",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/LocalCSE.cpp"
                            ,0x23d,
                            "void wasm::(anonymous namespace)::Applier::visitExpression(Expression *)"
                           );
            }
            p_Var5 = p_Var5->_M_nxt;
          } while ((p_Var5 != (_Hash_node_base *)0x0) &&
                  (p_Var6 = p_Var5[1]._M_nxt, (ulong)p_Var6 % uVar2 == uVar14));
        }
        std::__throw_out_of_range("_Map_base::at");
      }
    }
    else {
      auVar9._8_8_ = 0;
      auVar9._0_8_ = (curr->type).id;
      IVar10 = Builder::addVar((Builder *)
                               (this->
                               super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                               ).
                               super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                               .
                               super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                               .currFunction,(Function *)0x0,(Name)(auVar9 << 0x40),in_R8);
      pmVar11 = std::__detail::
                _Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_unsigned_int>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_unsigned_int>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&this->originalLocalMap,&local_40);
      pEVar13 = local_40;
      *pmVar11 = IVar10;
      type_.id = (local_40->type).id;
      this_00 = (LocalSet *)
                MixedArena::allocSpace
                          (&((this->
                             super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                             ).
                             super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                             .
                             super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                            .currModule)->allocator,0x20,8);
      (this_00->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id = LocalSetId
      ;
      (this_00->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.type.id = 0;
      this_00->index = IVar10;
      this_00->value = pEVar13;
      LocalSet::makeTee(this_00,type_);
      Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      ::replaceCurrent((Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                        *)this,(Expression *)this_00);
    }
  }
  return;
}

Assistant:

void visitExpression(Expression* curr) {
    auto iter = requestInfos.find(curr);
    if (iter == requestInfos.end()) {
      return;
    }

    const auto& info = iter->second;
    info.validate();

    if (info.requests) {
      // We have requests for this value. Add a local and tee the value to
      // there.
      Index local = originalLocalMap[curr] =
        Builder::addVar(getFunction(), curr->type);
      replaceCurrent(
        Builder(*getModule()).makeLocalTee(local, curr, curr->type));
    } else if (info.original) {
      auto& originalInfo = requestInfos.at(info.original);
      if (originalInfo.requests) {
        // This is a valid request of an original value. Get the value from the
        // local.
        assert(originalLocalMap.count(info.original));
        replaceCurrent(
          Builder(*getModule())
            .makeLocalGet(originalLocalMap[info.original], curr->type));
        originalInfo.requests--;
      }
    }
  }